

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O1

int Dau_DsdCheckDecExist_rec(char *pStr,char **p,int *pMatches,int *pnSupp)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  ulong *pnSupp_00;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  int pSupps [8];
  ulong local_58 [5];
  
  if (**p == '!') {
    *p = *p + 1;
  }
  pbVar4 = (byte *)*p;
  bVar1 = *pbVar4;
  if ((byte)(bVar1 + 0xbf) < 6 || (byte)(bVar1 - 0x30) < 10) {
    do {
      pbVar4 = pbVar4 + 1;
      *p = (char *)pbVar4;
      bVar1 = *pbVar4;
    } while ((byte)(bVar1 - 0x30) < 10 || (byte)(bVar1 + 0xbf) < 6);
  }
  if ((byte)(bVar1 + 0x9f) < 0x1a) {
    *pnSupp = *pnSupp + 1;
    return 0;
  }
  if (bVar1 < 0x5b) {
    if (bVar1 == 0x28) {
LAB_0041ac6e:
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      if ((int)(char)bVar1 + (uint)(bVar1 != 0x28) + 1 !=
          (int)pStr[pMatches[(long)pbVar4 - (long)pStr]]) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                      ,0x40,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      pbVar10 = (byte *)(pStr + pMatches[(long)pbVar4 - (long)pStr]);
      pbVar4 = pbVar4 + 1;
      *p = (char *)pbVar4;
      uVar7 = 0;
      uVar3 = 0;
      if (pbVar4 < pbVar10) {
        pnSupp_00 = local_58;
        uVar7 = 0;
        uVar3 = 0;
        do {
          uVar2 = Dau_DsdCheckDecExist_rec(pStr,p,pMatches,(int *)pnSupp_00);
          *pnSupp = *pnSupp + (int)*pnSupp_00;
          uVar3 = uVar3 | uVar2;
          pbVar4 = (byte *)(*p + 1);
          *p = (char *)pbVar4;
          pnSupp_00 = (ulong *)((long)pnSupp_00 + 4);
          uVar7 = uVar7 + 1;
        } while (pbVar4 < pbVar10);
      }
      if (pbVar4 != pbVar10) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                      ,0x46,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      if (uVar7 < 2) {
        __assert_fail("nParts > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                      ,0x47,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      uVar2 = 1;
      uVar6 = 1 << ((byte)uVar7 & 0x1f);
      if ((int)uVar6 < 2) {
        return uVar3;
      }
      while( true ) {
        uVar9 = 0;
        iVar5 = 0;
        do {
          if ((uVar2 >> ((uint)uVar9 & 0x1f) & 1) != 0) {
            iVar5 = iVar5 + *(int *)((long)local_58 + uVar9 * 4);
          }
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if (7 < iVar5 - 1U) break;
        uVar8 = 1 << ((byte)iVar5 & 0x1f);
        if (iVar5 < 2) {
          uVar8 = 0;
        }
        uVar3 = uVar3 | uVar8;
        uVar2 = uVar2 + 1;
        if (uVar2 == uVar6) {
          return uVar3;
        }
      }
      __assert_fail("Sum > 0 && Sum <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                    ,0x4f,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
    }
    if (bVar1 != 0x3c) {
LAB_0041aecc:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                    ,0x65,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
    }
  }
  else if (bVar1 != 0x7b) {
    if (bVar1 != 0x5b) goto LAB_0041aecc;
    goto LAB_0041ac6e;
  }
  if ((int)(char)bVar1 + (uint)(bVar1 != 0x28) + 1 != (int)pStr[pMatches[(long)pbVar4 - (long)pStr]]
     ) {
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                  ,0x5a,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
  }
  pbVar10 = (byte *)(pStr + pMatches[(long)pbVar4 - (long)pStr]);
  pbVar4 = pbVar4 + 1;
  *p = (char *)pbVar4;
  uVar7 = 0;
  if (pbVar4 < pbVar10) {
    uVar7 = 0;
    do {
      local_58[0] = local_58[0] & 0xffffffff00000000;
      uVar3 = Dau_DsdCheckDecExist_rec(pStr,p,pMatches,(int *)local_58);
      uVar7 = uVar7 | uVar3;
      *pnSupp = *pnSupp + (int)local_58[0];
      pbVar4 = (byte *)(*p + 1);
      *p = (char *)pbVar4;
    } while (pbVar4 < pbVar10);
  }
  if (pbVar4 == pbVar10) {
    return uVar7 | 1 << ((byte)*pnSupp & 0x1f);
  }
  __assert_fail("*p == q",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                ,0x61,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds all boundsets for which decomposition exists.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dau_DsdCheckDecExist_rec( char * pStr, char ** p, int * pMatches, int * pnSupp )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        (*pnSupp)++;
        return 0;
    }
    if ( **p == '(' || **p == '[' ) // and/xor
    {
        unsigned Mask = 0;
        int m, pSupps[8] = {0}, nParts = 0, nMints;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Mask |= Dau_DsdCheckDecExist_rec( pStr, p, pMatches, &pSupps[nParts] );
            *pnSupp += pSupps[nParts++];
        }
        assert( *p == q );
        assert( nParts > 1 );
        nMints = (1 << nParts);
        for ( m = 1; m < nMints; m++ )
        {
            int i, Sum = 0;
            for ( i = 0; i < nParts; i++ )
                if ( (m >> i) & 1 )
                    Sum += pSupps[i];
            assert( Sum > 0 && Sum <= 8 );
            if ( Sum >= 2 )
                Mask |= (1 << Sum);
        }
        return Mask;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        int uSupp;
        unsigned Mask = 0;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            uSupp = 0;
            Mask |= Dau_DsdCheckDecExist_rec( pStr, p, pMatches, &uSupp );
            *pnSupp += uSupp;
        }
        assert( *p == q );
        Mask |= (1 << *pnSupp);
        return Mask;
    }
    assert( 0 );
    return 0;
}